

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scoringtable_test.cpp
# Opt level: O0

void __thiscall
TEST_ScoringTableTest_DealerSelfDrawn_ManganOrMore_TestShell::
~TEST_ScoringTableTest_DealerSelfDrawn_ManganOrMore_TestShell
          (TEST_ScoringTableTest_DealerSelfDrawn_ManganOrMore_TestShell *this)

{
  TEST_ScoringTableTest_DealerSelfDrawn_ManganOrMore_TestShell *mem;
  TEST_ScoringTableTest_DealerSelfDrawn_ManganOrMore_TestShell *this_local;
  
  mem = this;
  ~TEST_ScoringTableTest_DealerSelfDrawn_ManganOrMore_TestShell(this);
  operator_delete(mem,(size_t)this);
  return;
}

Assistant:

TEST(ScoringTableTest, DealerSelfDrawn_ManganOrMore)
{
	CHECK_EQUAL(4000, t.dealerSelfDrawn(3, 70));
	CHECK_EQUAL(4000, t.dealerSelfDrawn(4, 40));
	CHECK_EQUAL(4000, t.dealerSelfDrawn(4, 70));
	CHECK_EQUAL(4000, t.dealerSelfDrawn(5, 0));

	CHECK_EQUAL(6000, t.dealerSelfDrawn(6, 0));
	CHECK_EQUAL(6000, t.dealerSelfDrawn(7, 0));

	CHECK_EQUAL(8000, t.dealerSelfDrawn(8, 0));
	CHECK_EQUAL(8000, t.dealerSelfDrawn(9, 0));
	CHECK_EQUAL(8000, t.dealerSelfDrawn(10, 0));

	CHECK_EQUAL(12000, t.dealerSelfDrawn(11, 0));
	CHECK_EQUAL(12000, t.dealerSelfDrawn(12, 0));

	CHECK_EQUAL(16000, t.dealerSelfDrawn(13, 0));
}